

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O1

column_t __thiscall duckdb::LogicalGet::GetAnyColumn(LogicalGet *this)

{
  __node_base_ptr p_Var1;
  column_t cVar2;
  
  p_Var1 = ::std::
           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(this->virtual_columns)._M_h,
                      0xfffffffffffffffe % (this->virtual_columns)._M_h._M_bucket_count,
                      &COLUMN_IDENTIFIER_EMPTY,0xfffffffffffffffe);
  if ((p_Var1 == (__node_base_ptr)0x0) ||
     (cVar2 = 0xfffffffffffffffe, p_Var1->_M_nxt == (_Hash_node_base *)0x0)) {
    p_Var1 = ::std::
             _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::_M_find_before_node
                       (&(this->virtual_columns)._M_h,
                        0xffffffffffffffff % (this->virtual_columns)._M_h._M_bucket_count,
                        &COLUMN_IDENTIFIER_ROW_ID,0xffffffffffffffff);
    cVar2 = 0;
    if ((p_Var1 != (__node_base_ptr)0x0) &&
       (cVar2 = 0xffffffffffffffff, p_Var1->_M_nxt == (_Hash_node_base *)0x0)) {
      cVar2 = 0;
    }
  }
  return cVar2;
}

Assistant:

column_t LogicalGet::GetAnyColumn() const {
	auto entry = virtual_columns.find(COLUMN_IDENTIFIER_EMPTY);
	if (entry != virtual_columns.end()) {
		// return the empty column if the projection supports it
		return COLUMN_IDENTIFIER_EMPTY;
	}
	entry = virtual_columns.find(COLUMN_IDENTIFIER_ROW_ID);
	if (entry != virtual_columns.end()) {
		// return the rowid column if the projection supports it
		return COLUMN_IDENTIFIER_ROW_ID;
	}
	// otherwise return the first column
	return 0;
}